

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O3

void __thiscall
Js::StepController::EndRecordingCall
          (StepController *this,Var returnValue,JavascriptFunction *function)

{
  StepType SVar1;
  ReturnedValueList *pRVar2;
  long lVar3;
  
  SVar1 = this->stepType;
  if ((SVar1 != STEP_NONE) &&
     (returnValue != (Var)0x0 && this->pActivatedContext != (ScriptContext *)0x0)) {
    if (this->pActivatedContext->threadContext->debugManager->isAtDispatchHalt == true) {
      Throw::FatalInternalError(-0x7fffbffb);
    }
    if (this->returnedValueRecordingDepth < 2) {
      if ((SVar1 == STEP_DOCUMENT) || (SVar1 == STEP_OUT)) {
        if (this->returnedValueRecordingDepth == 1) goto LAB_008c2fae;
        if (SVar1 == STEP_DOCUMENT) {
          pRVar2 = this->returnedValueList;
          lVar3 = (long)(pRVar2->
                        super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
                        count;
          if (lVar3 != 0) {
            memset((pRVar2->
                   super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
                   buffer.ptr,0,lVar3 << 3);
            (pRVar2->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
            count = 0;
          }
        }
      }
      AddToReturnedValueContainer(this,returnValue,function,false);
    }
  }
LAB_008c2fae:
  this->returnedValueRecordingDepth = this->returnedValueRecordingDepth + -1;
  return;
}

Assistant:

void StepController::EndRecordingCall(Js::Var returnValue, Js::JavascriptFunction * function)
    {
        if (IsActive() && this->pActivatedContext != nullptr && returnValue != nullptr)
        {
            if (this->pActivatedContext->GetThreadContext()->GetDebugManager()->IsAtDispatchHalt())
            {
                // OS bug 3050302 - Keeping this FatalError for finding other issues where we can record when we are at break
                Js::Throw::FatalInternalError();
            }
            bool isStepOut = stepType == STEP_OUT || stepType == STEP_DOCUMENT;

            // Record when :
            // If step-out/document : we need to record calls only which are already on the stack, that means the recording-depth is zero or negative.
            // if not step-out (step-in and step-over). only for those, which are called from the current call-site or the ones as if we step-out
            if ((!isStepOut && returnedValueRecordingDepth <= 1) || (isStepOut && returnedValueRecordingDepth <= 0))
            {
                // if we are step_document, we should be removing whatever we have collected so-far,
                // since they belong to the current document which is a library code
                if (stepType == STEP_DOCUMENT)
                {
                    this->returnedValueList->ClearAndZero();
                }

                AddToReturnedValueContainer(returnValue, function, false/*isValueOfReturnStatement*/);
            }
        }
        returnedValueRecordingDepth--;
    }